

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::first_real_span(basic_substring<const_char> *this)

{
  char cVar1;
  bool bVar2;
  error_flags eVar3;
  basic_substring<const_char> bVar4;
  csubstr in_stack_00000000;
  char next;
  basic_substring<const_char> word;
  size_t skip_start;
  basic_substring<const_char> ne;
  size_t in_stack_00000170;
  basic_substring<const_char> *in_stack_00000178;
  bool local_9a;
  bool local_99;
  basic_substring<char_const> local_88 [16];
  basic_substring<char_const> local_78 [16];
  basic_substring<char_const> local_68 [16];
  basic_substring<const_char> local_58;
  char *local_48;
  undefined4 local_40;
  ulong local_38;
  basic_substring<const_char> local_30;
  basic_substring<const_char> *local_18;
  basic_substring<const_char> *pos;
  basic_substring<const_char> *this_00;
  
  pos = local_18;
  local_30 = first_non_empty_span(local_18);
  this_00 = &local_30;
  bVar4 = local_30;
  if (local_30.len != 0 && local_30.str != (char *)0x0) {
    local_99 = true;
    if (*local_30.str != '+') {
      local_99 = *local_30.str == '-';
    }
    local_38 = (ulong)local_99;
    local_9a = 1 < local_38;
    if (local_9a) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_48 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_40 = 0x1877;
      handle_error(0x347f4b,(char *)0x1877,"check failed: %s","skip_start == 0 || skip_start == 1");
    }
    if (local_30.len < local_38 + 3) {
      bVar4 = _first_real_span_dec(in_stack_00000178,in_stack_00000170);
    }
    else if (local_30.str[local_38] == '0') {
      cVar1 = local_30.str[local_38 + 1];
      if ((cVar1 == 'x') || (cVar1 == 'X')) {
        bVar4 = _first_real_span_hex(in_stack_00000178,in_stack_00000170);
      }
      else if ((cVar1 == 'b') || (cVar1 == 'B')) {
        bVar4 = _first_real_span_bin(in_stack_00000178,in_stack_00000170);
      }
      else if ((cVar1 == 'o') || (cVar1 == 'O')) {
        bVar4 = _first_real_span_oct(in_stack_00000178,in_stack_00000170);
      }
      else {
        bVar4 = _first_real_span_dec(in_stack_00000178,in_stack_00000170);
      }
    }
    else if (local_30.str[local_38] == 'i') {
      basic_substring<char_const>::basic_substring<8ul>(local_68,(char (*) [8])"nfinity");
      local_58 = _word_follows(this_00,(size_t)pos,in_stack_00000000);
      bVar4 = local_58;
      if (local_58.len == 0) {
        basic_substring<char_const>::basic_substring<3ul>(local_78,(char (*) [3])"nf");
        bVar4 = _word_follows(this_00,(size_t)pos,in_stack_00000000);
      }
    }
    else if (local_30.str[local_38] == 'n') {
      basic_substring<char_const>::basic_substring<3ul>(local_88,(char (*) [3])0x34430e);
      bVar4 = _word_follows(this_00,(size_t)pos,in_stack_00000000);
    }
    else {
      bVar4 = _first_real_span_dec(in_stack_00000178,in_stack_00000170);
    }
  }
  _local_18 = bVar4;
  return _local_18;
}

Assistant:

basic_substring first_real_span() const
    {
        basic_substring ne = first_non_empty_span();
        if(ne.empty())
            return ne;
        size_t skip_start = (ne.str[0] == '+' || ne.str[0] == '-');
        C4_ASSERT(skip_start == 0 || skip_start == 1);
        // if we have at least three digits after the leading sign, it
        // can be decimal, or hex, or bin or oct. Ex:
        // non-decimal: 0x0, 0b0, 0o0
        // decimal: 1.0, 10., 1e1, 100, inf, nan, infinity
        if(ne.len >= skip_start+3)
        {
            // if it does not have leading 0, it must be decimal, or it is not a real
            if(ne.str[skip_start] != '0')
            {
                if(ne.str[skip_start] == 'i') // is it infinity or inf?
                {
                    basic_substring word = ne._word_follows(skip_start + 1, "nfinity");
                    if(word.len)
                        return word;
                    return ne._word_follows(skip_start + 1, "nf");
                }
                else if(ne.str[skip_start] == 'n') // is it nan?
                {
                    return ne._word_follows(skip_start + 1, "an");
                }
                else // must be a decimal, or it is not a real
                {
                    return ne._first_real_span_dec(skip_start);
                }
            }
            else // starts with 0. is it 0x, 0b or 0o?
            {
                const char next = ne.str[skip_start + 1];
                // hexadecimal
                if(next == 'x' || next == 'X')
                    return ne._first_real_span_hex(skip_start + 2);
                // binary
                else if(next == 'b' || next == 'B')
                    return ne._first_real_span_bin(skip_start + 2);
                // octal
                else if(next == 'o' || next == 'O')
                    return ne._first_real_span_oct(skip_start + 2);
                // none of the above. may still be a decimal.
                else
                    return ne._first_real_span_dec(skip_start); // do not skip the 0.
            }
        }
        // less than 3 chars after the leading sign. It is either a
        // decimal or it is not a real. (cannot be any of 0x0, etc).
        return ne._first_real_span_dec(skip_start);
    }